

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  bool bVar1;
  byte local_29;
  SPIRType *local_20;
  SPIRType *type;
  uint32_t type_id_local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  local_20 = get<spirv_cross::SPIRType>(this->compiler,type_id);
  type._4_4_ = type_id;
  while( true ) {
    local_29 = 0;
    if (((local_20->pointer & 1U) != 0) &&
       (local_29 = 0, local_20->storage == StorageClassPhysicalStorageBuffer)) {
      bVar1 = type_is_bda_block_entry(this,type._4_4_);
      local_29 = bVar1 ^ 0xff;
    }
    if ((local_29 & 1) == 0) break;
    type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->parent_type);
    local_20 = get<spirv_cross::SPIRType>(this->compiler,type._4_4_);
  }
  bVar1 = type_is_bda_block_entry(this,type._4_4_);
  if (!bVar1) {
    __assert_fail("type_is_bda_block_entry(type_id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross.cpp"
                  ,0x13ea,
                  "uint32_t spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t) const"
                 );
  }
  return type._4_4_;
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t type_id) const
{
	auto *type = &compiler.get<SPIRType>(type_id);
	while (type->pointer &&
	       type->storage == StorageClassPhysicalStorageBufferEXT &&
	       !type_is_bda_block_entry(type_id))
	{
		type_id = type->parent_type;
		type = &compiler.get<SPIRType>(type_id);
	}

	assert(type_is_bda_block_entry(type_id));
	return type_id;
}